

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRConstant * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::allocate<unsigned_int&>
          (ObjectPool<spirv_cross::SPIRConstant> *this,uint *p)

{
  size_t sVar1;
  _Tuple_impl<0UL,_spirv_cross::SPIRConstant_*,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>
  _Var2;
  ulong uVar3;
  uint uVar4;
  _Head_base<0UL,_spirv_cross::SPIRConstant_*,_false> _Var5;
  SPIRConstant *this_00;
  
  if ((this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.buffer_size == 0) {
    uVar4 = this->start_object_count <<
            ((byte)(this->memory).
                   super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
                   .buffer_size & 0x1f);
    uVar3 = (ulong)uVar4;
    _Var2.super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>)malloc(uVar3 * 0x168);
    if (_Var2.super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>._M_head_impl !=
        (SPIRConstant *)0x0) {
      _Var5._M_head_impl =
           (SPIRConstant *)
           _Var2.super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>._M_head_impl;
      if (uVar4 != 0) {
        do {
          SmallVector<spirv_cross::SPIRConstant_*,_0UL>::reserve
                    (&this->vacants,
                     (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.buffer_size + 1);
          sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.buffer_size;
          (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.ptr[sVar1] =
               _Var5._M_head_impl;
          (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.buffer_size = sVar1 + 1;
          uVar3 = uVar3 - 1;
          _Var5._M_head_impl = _Var5._M_head_impl + 1;
        } while (uVar3 != 0);
      }
      SmallVector<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>,_8UL>
      ::reserve(&this->memory,
                (this->memory).
                super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
                .buffer_size + 1);
      sVar1 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
      .ptr[sVar1]._M_t.
      super___uniq_ptr_impl<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_spirv_cross::SPIRConstant_*,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>
      .super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false> =
           _Var2.super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
      .buffer_size = sVar1 + 1;
      if (_Var2.super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>._M_head_impl !=
          (SPIRConstant *)0x0) goto LAB_002c859c;
    }
    this_00 = (SPIRConstant *)0x0;
  }
  else {
LAB_002c859c:
    sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.buffer_size;
    this_00 = (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.ptr[sVar1 - 1];
    if (sVar1 != 0) {
      SmallVector<spirv_cross::SPIRConstant_*,_0UL>::resize(&this->vacants,sVar1 - 1);
    }
    SPIRConstant::SPIRConstant(this_00,*p);
  }
  return this_00;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}